

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O3

void rw::ps2::convertPalette(Raster *raster)

{
  undefined4 uVar1;
  uint8 *puVar2;
  int i;
  long lVar3;
  ulong uVar4;
  
  if ((raster->format & 0x2f00U) == 0x2500) {
    puVar2 = raster->palette;
    lVar3 = 0;
    do {
      if (((uint)lVar3 & 0x18) == 0x10) {
        uVar1 = *(undefined4 *)(puVar2 + lVar3 * 4);
        uVar4 = (ulong)((uint)lVar3 & 0xffffffe7);
        *(undefined4 *)(puVar2 + lVar3 * 4) = *(undefined4 *)(puVar2 + uVar4 * 4 + 0x20);
        *(undefined4 *)(puVar2 + uVar4 * 4 + 0x20) = uVar1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
  }
  return;
}

Assistant:

static void
convertPalette(Raster *raster)
{
	if(raster->format & Raster::PAL8){
		if((raster->format & 0xF00) == Raster::C8888)
			convertCSM1_32((uint32*)raster->palette);
		else if((raster->format & 0xF00) == Raster::C8888)
			convertCSM1_16((uint32*)raster->palette);
	}
}